

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_verify(picnic_publickey_t *pk,uint8_t *message,size_t message_len,uint8_t *signature,
                 size_t signature_len)

{
  picnic_params_t param_00;
  picnic_instance_t *ppVar1;
  long in_RCX;
  byte *in_RDI;
  long in_R8;
  picnic_context_t context;
  uint8_t *pk_pt;
  uint8_t *pk_c;
  picnic_instance_t *instance;
  picnic_params_t param;
  size_t in_stack_00000b60;
  uint8_t *in_stack_00000b68;
  picnic_context_t *in_stack_00000b70;
  picnic_instance_t *in_stack_00000b78;
  size_t in_stack_ffffffffffffff08;
  uint8_t *in_stack_ffffffffffffff10;
  mzd_local_t *in_stack_ffffffffffffff18;
  uint8_t *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  uint8_t *in_stack_ffffffffffffff58;
  uint8_t *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  size_t in_stack_ffffffffffffff78;
  undefined4 local_34;
  
  if (((in_RDI == (byte *)0x0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_34 = -1;
  }
  else {
    param_00 = (picnic_params_t)*in_RDI;
    ppVar1 = picnic_instance_get(param_00);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_34 = -1;
    }
    else if (((param_00 == Picnic3_L1) || (param_00 == Picnic3_L3)) || (param_00 == Picnic3_L5)) {
      local_34 = impl_verify_picnic3((picnic_instance_t *)
                                     CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff78);
    }
    else {
      mzd_from_char_array(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
      mzd_from_char_array(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
      picnic_instance_is_unruh(param_00);
      local_34 = picnic_impl_verify(in_stack_00000b78,in_stack_00000b70,in_stack_00000b68,
                                    in_stack_00000b60);
    }
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_verify(const picnic_publickey_t* pk, const uint8_t* message,
                                            size_t message_len, const uint8_t* signature,
                                            size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_params_t param       = pk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk, instance);

  if (param == Picnic3_L1 || param == Picnic3_L3 || param == Picnic3_L5) {
#if defined(WITH_KKW)
    return impl_verify_picnic3(instance, pk_pt, pk_c, message, message_len, signature,
                               signature_len);
#else
    return -1;
#endif
  } else {
#if defined(WITH_ZKBPP)
    picnic_context_t context;
    mzd_from_char_array(context.m_plaintext, pk_pt, instance->input_output_size);
    mzd_from_char_array(context.m_key, pk_c, instance->input_output_size);
    context.plaintext   = pk_pt;
    context.private_key = NULL;
    context.public_key  = pk_c;
    context.msg         = message;
    context.msglen      = message_len;
#if defined(WITH_UNRUH)
    context.unruh = picnic_instance_is_unruh(param);
#endif
    return picnic_impl_verify(instance, &context, signature, signature_len);
#else
    return -1;
#endif
  }
}